

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,void **vtt)

{
  void *pvVar1;
  long *plVar2;
  long lVar3;
  long local_30;
  
  TPZIntelGen<pzshape::TPZShapeLinear>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeLinear>,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fSideOrient).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x68) = vtt[9]
  ;
  TPZManVector<int,_2>::TPZManVector(&this->fSideOrient,0);
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  local_30 = -1;
  TPZManVector<long,_3>::TPZManVector(&this->fConnectIndexes,3,&local_30);
  this->fhdivfam = EHDivStandard;
  (this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = -1;
  plVar2 = (this->fConnectIndexes).super_TPZVec<long>.fStore;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    plVar2[lVar3] = -1;
  }
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv() :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}